

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::LexMultiLineComment(Lexer *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char (*in_RDI) [49];
  int unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  LexException *in_stack_00000010;
  bool is_comment_end;
  Lexer *in_stack_ffffffffffffffd0;
  char (*args) [49];
  
  bVar1 = false;
  args = in_RDI;
  while( true ) {
    while( true ) {
      if (bVar1) {
        return;
      }
      if (*(int *)(*in_RDI + 0x30) != 0x5d) break;
      iVar2 = Next(in_stack_ffffffffffffffd0);
      *(int *)(*in_RDI + 0x30) = iVar2;
      if (*(int *)(*in_RDI + 0x30) == 0x5d) {
        bVar1 = true;
        iVar2 = Next(in_stack_ffffffffffffffd0);
        *(int *)(*in_RDI + 0x30) = iVar2;
      }
    }
    if (*(int *)(*in_RDI + 0x30) == -1) break;
    if ((*(int *)(*in_RDI + 0x30) == 0xd) || (*(int *)(*in_RDI + 0x30) == 10)) {
      LexNewLine(in_stack_ffffffffffffffd0);
    }
    else {
      iVar2 = Next(in_stack_ffffffffffffffd0);
      *(int *)(*in_RDI + 0x30) = iVar2;
    }
  }
  uVar3 = __cxa_allocate_exception(0x20);
  String::GetCStr(*(String **)(*in_RDI + 8));
  LexException::LexException<char_const(&)[49]>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,args);
  __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
}

Assistant:

void Lexer::LexMultiLineComment()
    {
        bool is_comment_end = false;
        while (!is_comment_end)
        {
            if (current_ == ']')
            {
                current_ = Next();
                if (current_ == ']')
                {
                    is_comment_end = true;
                    current_ = Next();
                }
            }
            else if (current_ == EOF)
            {
                // uncompleted multi-line comment
                throw LexException(module_->GetCStr(), line_, column_,
                        "expect complete multi-line comment before <eof>.");
            }
            else if (current_ == '\r' || current_ == '\n')
            {
                LexNewLine();
            }
            else
            {
                current_ = Next();
            }
        }
    }